

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.h
# Opt level: O2

void __thiscall
HighsImplications::HighsImplications(HighsImplications *this,HighsMipSolver *mipsolver)

{
  HighsInt HVar1;
  size_type __new_size;
  
  (this->implications).
  super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->implications).
  super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->implications).
  super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vubs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vubs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vubs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vlbs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vlbs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vlbs).
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mipsolver = mipsolver;
  (this->substitutions).super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->substitutions).super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->substitutions).super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colsubstituted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colsubstituted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colsubstituted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->storeLiftingOpportunity).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->storeLiftingOpportunity).super__Function_base._M_functor + 8) = 0;
  (this->storeLiftingOpportunity).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->storeLiftingOpportunity)._M_invoker = (_Invoker_type)0x0;
  __new_size = (size_type)mipsolver->model_->num_col_;
  std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::resize
            (&this->implications,__new_size * 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->colsubstituted,__new_size);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::resize(&this->vubs,__new_size);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::resize(&this->vlbs,__new_size);
  HVar1 = HighsMipSolver::numNonzero(mipsolver);
  this->nextCleanupCall = HVar1;
  this->numImplications = 0;
  return;
}

Assistant:

HighsImplications(const HighsMipSolver& mipsolver) : mipsolver(mipsolver) {
    HighsInt numcol = mipsolver.numCol();
    implications.resize(2 * static_cast<size_t>(numcol));
    colsubstituted.resize(numcol);
    vubs.resize(numcol);
    vlbs.resize(numcol);
    nextCleanupCall = mipsolver.numNonzero();
    numImplications = 0;
  }